

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

char ** bc_str_split(char *str,char c,size_t max_pieces)

{
  void *ptr;
  size_t sVar1;
  void *__dest;
  char **ppcVar2;
  ulong uVar3;
  long lVar4;
  long local_38;
  
  if (str == (char *)0x0) {
    ppcVar2 = (char **)0x0;
  }
  else {
    ptr = bc_malloc(8);
    sVar1 = strlen(str);
    if (sVar1 == 0xffffffffffffffff) {
      lVar4 = 0;
    }
    else {
      lVar4 = 0;
      local_38 = 0;
      uVar3 = 0;
      do {
        if (*str == '\0') break;
        if (str[uVar3] == c) {
          if (lVar4 + 1U <= max_pieces - 1 || c == '\0') {
LAB_00109487:
            ptr = bc_realloc(ptr,(lVar4 + 1) * 8);
            __dest = bc_malloc((uVar3 - local_38) + 1);
            *(void **)((long)ptr + lVar4 * 8) = __dest;
            memcpy(__dest,str + local_38,uVar3 - local_38);
            *(undefined1 *)((long)__dest + (uVar3 - local_38)) = 0;
            local_38 = uVar3 + 1;
            lVar4 = lVar4 + 1;
          }
        }
        else if (str[uVar3] == '\0') goto LAB_00109487;
        uVar3 = uVar3 + 1;
        sVar1 = strlen(str);
      } while (uVar3 < sVar1 + 1);
    }
    ppcVar2 = (char **)bc_realloc(ptr,lVar4 * 8 + 8);
    ppcVar2[lVar4] = (char *)0x0;
  }
  return ppcVar2;
}

Assistant:

char**
bc_str_split(const char *str, char c, size_t max_pieces)
{
    if (str == NULL)
        return NULL;
    char **rv = bc_malloc(sizeof(char*));
    size_t i, start = 0, count = 0;
    for (i = 0; i < strlen(str) + 1; i++) {
        if (str[0] == '\0')
            break;
        if ((str[i] == c && (!max_pieces || count + 1 < max_pieces)) || str[i] == '\0') {
            rv = bc_realloc(rv, (count + 1) * sizeof(char*));
            rv[count] = bc_malloc(i - start + 1);
            memcpy(rv[count], str + start, i - start);
            rv[count++][i - start] = '\0';
            start = i + 1;
        }
    }
    rv = bc_realloc(rv, (count + 1) * sizeof(char*));
    rv[count] = NULL;
    return rv;
}